

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::base::PeriodicTask::Start(PeriodicTask *this,Args *args)

{
  TaskRunner *pTVar1;
  bool bVar2;
  uint uVar3;
  type local_80;
  function<void_()> local_60;
  undefined1 local_40 [8];
  WeakPtr<perfetto::base::PeriodicTask> weak_this;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  local_1c;
  Args *local_18;
  Args *args_local;
  PeriodicTask *this_local;
  
  local_18 = args;
  args_local = (Args *)this;
  Reset(this);
  if ((args->period_ms != 0) &&
     (bVar2 = ::std::function::operator_cast_to_bool((function *)&args->task), bVar2)) {
    Args::operator=(&this->args_,args);
    if (((this->args_).use_suspend_aware_timer & 1U) != 0) {
      anon_unknown_0::CreateTimerFd((anon_unknown_0 *)&local_1c,(this->args_).period_ms);
      ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
      ::operator=(&this->timer_fd_,&local_1c);
      ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
      ::~ScopedResource(&local_1c);
      bVar2 = ScopedResource::operator_cast_to_bool((ScopedResource *)&this->timer_fd_);
      if (bVar2) {
        WeakPtrFactory<perfetto::base::PeriodicTask>::GetWeakPtr
                  ((WeakPtrFactory<perfetto::base::PeriodicTask> *)local_40);
        pTVar1 = this->task_runner_;
        uVar3 = ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
                ::operator*(&this->timer_fd_);
        ::std::
        bind<void(&)(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,unsigned_int),perfetto::base::WeakPtr<perfetto::base::PeriodicTask>&,unsigned_int&>
                  (&local_80,RunTaskAndPostNext,(WeakPtr<perfetto::base::PeriodicTask> *)local_40,
                   &this->generation_);
        ::std::function<void()>::
        function<std::_Bind<void(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,unsigned_int)>,void>
                  ((function<void()> *)&local_60,&local_80);
        (*pTVar1->_vptr_TaskRunner[4])(pTVar1,(ulong)uVar3,&local_60);
        ::std::function<void_()>::~function(&local_60);
        std::
        _Bind<void_(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int)>
        ::~_Bind(&local_80);
        WeakPtr<perfetto::base::PeriodicTask>::~WeakPtr
                  ((WeakPtr<perfetto::base::PeriodicTask> *)local_40);
      }
      else {
        ignore_result<char[55]>
                  ((char (*) [55])"timerfd not supported, falling back on PostDelayedTask");
      }
    }
    bVar2 = ScopedResource::operator_cast_to_bool((ScopedResource *)&this->timer_fd_);
    if (!bVar2) {
      PostNextTask(this);
    }
    if (((this->args_).start_first_task_immediately & 1U) != 0) {
      std::function<void_()>::operator()(&(this->args_).task);
    }
  }
  return;
}

Assistant:

void PeriodicTask::Start(Args args) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  Reset();
  if (args.period_ms == 0 || !args.task) {
    PERFETTO_DCHECK(args.period_ms > 0);
    PERFETTO_DCHECK(args.task);
    return;
  }
  args_ = std::move(args);
  if (args_.use_suspend_aware_timer) {
    timer_fd_ = CreateTimerFd(args_.period_ms);
    if (timer_fd_) {
      auto weak_this = weak_ptr_factory_.GetWeakPtr();
      task_runner_->AddFileDescriptorWatch(
          *timer_fd_,
          std::bind(PeriodicTask::RunTaskAndPostNext, weak_this, generation_));
    } else {
      PERFETTO_DPLOG("timerfd not supported, falling back on PostDelayedTask");
    }
  }  // if (use_suspend_aware_timer).

  if (!timer_fd_)
    PostNextTask();

  if (args_.start_first_task_immediately)
    args_.task();
}